

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int num_bytes_in_utf8_sequence(uchar c)

{
  undefined4 local_c;
  uchar c_local;
  
  if ((((c == 0xc0) || (c == 0xc1)) || (0xf4 < c)) || ((c & 0xc0) == 0x80)) {
    local_c = 0;
  }
  else if ((c & 0x80) == 0) {
    local_c = 1;
  }
  else if ((c & 0xe0) == 0xc0) {
    local_c = 2;
  }
  else if ((c & 0xf0) == 0xe0) {
    local_c = 3;
  }
  else if ((c & 0xf8) == 0xf0) {
    local_c = 4;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int num_bytes_in_utf8_sequence(unsigned char c) {
    if (c == 0xC0 || c == 0xC1 || c > 0xF4 || IS_CONT(c)) {
        return 0;
    } else if ((c & 0x80) == 0) {    /* 0xxxxxxx */
        return 1;
    } else if ((c & 0xE0) == 0xC0) { /* 110xxxxx */
        return 2;
    } else if ((c & 0xF0) == 0xE0) { /* 1110xxxx */
        return 3;
    } else if ((c & 0xF8) == 0xF0) { /* 11110xxx */
        return 4;
    }
    return 0; /* won't happen */
}